

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureFormatTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles31::Functional::TextureCubeArrayFormatCase::testLayerFace
          (TextureCubeArrayFormatCase *this,int layerFaceNdx)

{
  TestLog *pTVar1;
  RenderContext *context;
  undefined8 name;
  bool bVar2;
  int iVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar7;
  undefined4 extraout_var_02;
  TextureFormat *pTVar8;
  long *plVar9;
  TextureFormat TVar10;
  long *plVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  byte bVar15;
  uint uVar16;
  CubeFace face;
  RandomViewport viewport;
  vector<float,_std::allocator<float>_> texCoord;
  Surface renderedFrame;
  Surface referenceFrame;
  TextureFormatInfo spec;
  RandomViewport local_368;
  TextureCubeArrayView local_358;
  long local_348;
  TextureFormat TStack_340;
  vector<float,_std::allocator<float>_> local_338;
  TestLog *local_320;
  Surface local_318;
  ulong local_300;
  long *local_2f8;
  long local_2f0;
  long local_2e8;
  long lStack_2e0;
  Vec2 local_2d8 [2];
  long local_2c8 [2];
  Surface local_2b8;
  long *local_2a0 [2];
  long local_290 [2];
  ReferenceParams local_27c;
  PixelBufferAccess local_1e8 [2];
  ios_base local_178 [264];
  TextureFormatInfo local_70;
  long lVar6;
  undefined4 extraout_var_01;
  
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  pTVar1 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar3 = this->m_size;
  dVar5 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&local_368,(RenderTarget *)CONCAT44(extraout_var_00,iVar4),iVar3,iVar3,dVar5);
  tcu::Surface::Surface(&local_318,local_368.width,local_368.height);
  tcu::Surface::Surface(&local_2b8,local_368.width,local_368.height);
  local_320 = pTVar1;
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  lVar7 = CONCAT44(extraout_var_01,iVar3);
  bVar15 = 8 - *(char *)(lVar7 + 8);
  uVar13 = 0;
  if (0 < *(int *)(lVar7 + 0x14)) {
    uVar13 = 0x1000000 << (8U - (char)*(int *)(lVar7 + 0x14) & 0x1f);
  }
  uVar14 = 0x100 << (8U - *(char *)(lVar7 + 0xc) & 0x1f) | 1 << (bVar15 & 0x1f);
  uVar13 = 0x10000 << (8U - *(char *)(lVar7 + 0x10) & 0x1f) | uVar14 | uVar13;
  uVar16 = 1 << (bVar15 & 0x1f) & 0xff;
  if (0xfd < uVar16) {
    uVar16 = 0xfe;
  }
  uVar14 = uVar14 >> 8 & 0xff;
  if (0xfd < uVar14) {
    uVar14 = 0xfe;
  }
  uVar12 = uVar13 >> 0x10 & 0xff;
  if (0xfd < uVar12) {
    uVar12 = 0xfe;
  }
  local_300 = (ulong)uVar12;
  uVar13 = uVar13 >> 0x18;
  if (0xfd < uVar13) {
    uVar13 = 0xfe;
  }
  local_338.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (float *)0x0;
  local_338.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_338.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  glu::TextureTestUtil::ReferenceParams::ReferenceParams(&local_27c,TEXTURETYPE_CUBE_ARRAY);
  tcu::getTextureFormatInfo(&local_70,(TextureFormat *)&this->m_texture->m_refTexture);
  face = CUBEFACE_LAST;
  if ((uint)(layerFaceNdx % 6) < 6) {
    face = *(CubeFace *)(&DAT_01c5902c + (ulong)(uint)(layerFaceNdx % 6) * 4);
  }
  local_27c.super_RenderParams.samplerType =
       glu::TextureTestUtil::getSamplerType
                 ((this->m_texture->m_refTexture).super_TextureLevelPyramid.m_format);
  local_27c.sampler.wrapS = CLAMP_TO_EDGE;
  local_27c.sampler.wrapT = CLAMP_TO_EDGE;
  local_27c.sampler.wrapR = CLAMP_TO_EDGE;
  local_27c.sampler.minFilter = NEAREST;
  local_27c.sampler.magFilter = NEAREST;
  local_27c.sampler.lodThreshold = 0.0;
  local_27c.sampler.normalizedCoords = true;
  local_27c.sampler.borderColor.v._8_8_ = 0;
  local_27c.sampler.compare = COMPAREMODE_NONE;
  local_27c.sampler.compareChannel = 0;
  local_27c.sampler.borderColor.v._0_8_ = 0;
  local_27c.sampler.seamlessCubeMap = true;
  local_27c.sampler._53_3_ = 0;
  local_27c.sampler.depthStencilMode = MODE_DEPTH;
  local_27c.super_RenderParams.colorScale.m_data[0] = local_70.lookupScale.m_data[0];
  local_27c.super_RenderParams.colorScale.m_data[1] = local_70.lookupScale.m_data[1];
  local_27c.super_RenderParams.colorScale.m_data[2] = local_70.lookupScale.m_data[2];
  local_27c.super_RenderParams.colorScale.m_data[3] = local_70.lookupScale.m_data[3];
  local_27c.super_RenderParams.colorBias.m_data[0] = local_70.lookupBias.m_data[0];
  local_27c.super_RenderParams.colorBias.m_data[1] = local_70.lookupBias.m_data[1];
  local_27c.super_RenderParams.colorBias.m_data[2] = local_70.lookupBias.m_data[2];
  local_27c.super_RenderParams.colorBias.m_data[3] = local_70.lookupBias.m_data[3];
  local_1e8[0].super_ConstPixelBufferAccess.m_format.order = R;
  local_1e8[0].super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
  local_2d8[0].m_data[0] = (float)(layerFaceNdx / 6);
  local_358.m_numLevels = 0x3f800000;
  local_358._4_4_ = 0x3f800000;
  local_2d8[0].m_data[1] = local_2d8[0].m_data[0];
  glu::TextureTestUtil::computeQuadTexCoordCubeArray
            (&local_338,face,(Vec2 *)local_1e8,(Vec2 *)&local_358,local_2d8);
  (**(code **)(lVar6 + 0x188))(0x4500);
  (**(code **)(lVar6 + 0x1a00))(local_368.x,local_368.y,local_368.width,local_368.height);
  glu::TextureCubeArray::upload(this->m_texture);
  (**(code **)(lVar6 + 8))(0x84c0);
  (**(code **)(lVar6 + 0xb8))(0x9009,this->m_texture->m_glTexture);
  (**(code **)(lVar6 + 0x1360))(0x9009,0x2802,0x812f);
  (**(code **)(lVar6 + 0x1360))(0x9009,0x2803,0x812f);
  (**(code **)(lVar6 + 0x1360))(0x9009,0x2801,0x2600);
  (**(code **)(lVar6 + 0x1360))(0x9009,0x2800,0x2600);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"Set texturing state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureFormatTests.cpp"
                  ,0xd7);
  deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
            (&this->m_renderer,0,
             local_338.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,&local_27c.super_RenderParams);
  context = this->m_renderCtx;
  local_358.m_numLevels = RGBA;
  local_358._4_4_ = UNORM_INT8;
  if ((void *)local_318.m_pixels.m_cap != (void *)0x0) {
    local_318.m_pixels.m_cap = (size_t)local_318.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            (local_1e8,(TextureFormat *)&local_358,local_318.m_width,local_318.m_height,1,
             (void *)local_318.m_pixels.m_cap);
  glu::readPixels(context,local_368.x,local_368.y,local_1e8);
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  tcu::SurfaceAccess::SurfaceAccess
            ((SurfaceAccess *)local_1e8,&local_2b8,
             (PixelFormat *)(CONCAT44(extraout_var_02,iVar3) + 8));
  local_358.m_levels = (this->m_texture->m_refTexture).m_view.m_levels;
  local_358.m_numLevels = (this->m_texture->m_refTexture).m_view.m_numLevels;
  glu::TextureTestUtil::sampleTexture
            ((SurfaceAccess *)local_1e8,&local_358,
             local_338.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,&local_27c);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
  std::ostream::operator<<(local_1e8,layerFaceNdx);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
  std::ios_base::~ios_base(local_178);
  pTVar8 = (TextureFormat *)std::__cxx11::string::replace((ulong)local_2d8,0,(char *)0x0,0x1c58ebb);
  TVar10 = (TextureFormat)(pTVar8 + 2);
  if (*pTVar8 == TVar10) {
    local_348 = *(long *)TVar10;
    TStack_340 = pTVar8[3];
    local_358._0_8_ = &local_348;
  }
  else {
    local_348 = *(long *)TVar10;
    local_358._0_8_ = *pTVar8;
  }
  name = local_358._0_8_;
  local_358.m_levels = *(ConstPixelBufferAccess **)(pTVar8 + 1);
  *pTVar8 = TVar10;
  pTVar8[1].order = R;
  pTVar8[1].type = SNORM_INT8;
  *(undefined1 *)&pTVar8[2].order = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
  std::ostream::operator<<(local_1e8,layerFaceNdx);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
  std::ios_base::~ios_base(local_178);
  plVar9 = (long *)std::__cxx11::string::replace((ulong)local_2a0,0,(char *)0x0,0x1c58ec5);
  plVar11 = plVar9 + 2;
  if ((long *)*plVar9 == plVar11) {
    local_2e8 = *plVar11;
    lStack_2e0 = plVar9[3];
    local_2f8 = &local_2e8;
  }
  else {
    local_2e8 = *plVar11;
    local_2f8 = (long *)*plVar9;
  }
  local_2f0 = plVar9[1];
  *plVar9 = (long)plVar11;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  bVar2 = glu::TextureTestUtil::compareImages
                    (local_320,(char *)name,(char *)local_2f8,&local_2b8,&local_318,
                     (RGBA)(uVar13 * 0x1000000 + ((int)local_300 << 0x10 | uVar14 * 0x100 + uVar16)
                           + 0x1010101));
  if (local_2f8 != &local_2e8) {
    operator_delete(local_2f8,local_2e8 + 1);
  }
  if (local_2a0[0] != local_290) {
    operator_delete(local_2a0[0],local_290[0] + 1);
  }
  if ((long *)local_358._0_8_ != &local_348) {
    operator_delete((void *)local_358._0_8_,local_348 + 1);
  }
  if ((long *)CONCAT44(local_2d8[0].m_data[1],local_2d8[0].m_data[0]) != local_2c8) {
    operator_delete((long *)CONCAT44(local_2d8[0].m_data[1],local_2d8[0].m_data[0]),local_2c8[0] + 1
                   );
  }
  if (local_338.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_338.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_338.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_338.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  tcu::Surface::~Surface(&local_2b8);
  tcu::Surface::~Surface(&local_318);
  return bVar2;
}

Assistant:

bool TextureCubeArrayFormatCase::testLayerFace (int layerFaceNdx)
{
	const glw::Functions&	gl				= m_renderCtx.getFunctions();
	TestLog&				log				= m_testCtx.getLog();
	RandomViewport			viewport		(m_renderCtx.getRenderTarget(), m_size, m_size, deStringHash(getName()));
	tcu::Surface			renderedFrame	(viewport.width, viewport.height);
	tcu::Surface			referenceFrame	(viewport.width, viewport.height);
	tcu::RGBA				threshold		= m_renderCtx.getRenderTarget().getPixelFormat().getColorThreshold() + tcu::RGBA(1,1,1,1);
	vector<float>			texCoord;
	ReferenceParams			renderParams	(TEXTURETYPE_CUBE_ARRAY);
	tcu::TextureFormatInfo	spec			= tcu::getTextureFormatInfo(m_texture->getRefTexture().getFormat());
	const int				layerNdx		= layerFaceNdx / 6;
	const tcu::CubeFace		face			= getCubeFaceFromNdx(layerFaceNdx % 6);

	renderParams.samplerType				= getSamplerType(m_texture->getRefTexture().getFormat());
	renderParams.sampler					= Sampler(Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::NEAREST, Sampler::NEAREST);
	renderParams.sampler.seamlessCubeMap	= true;
	renderParams.colorScale					= spec.lookupScale;
	renderParams.colorBias					= spec.lookupBias;

	// Layer here specifies the cube slice
	computeQuadTexCoordCubeArray(texCoord, face, tcu::Vec2(0.0f, 0.0f), tcu::Vec2(1.0f, 1.0f), tcu::Vec2((float)layerNdx));

	// Setup base viewport.
	gl.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);
	gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);

	// Upload texture data to GL.
	m_texture->upload();

	// Bind to unit 0.
	gl.activeTexture(GL_TEXTURE0);
	gl.bindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, m_texture->getGLTexture());

	// Setup nearest neighbor filtering and clamp-to-edge.
	gl.texParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Set texturing state");

	// Draw.
	m_renderer.renderQuad(0, &texCoord[0], renderParams);
	glu::readPixels(m_renderCtx, viewport.x, viewport.y, renderedFrame.getAccess());

	// Compute reference.
	sampleTexture(tcu::SurfaceAccess(referenceFrame, m_renderCtx.getRenderTarget().getPixelFormat()), m_texture->getRefTexture(), &texCoord[0], renderParams);

	// Compare and log.
	return compareImages(log, (string("LayerFace" + de::toString(layerFaceNdx))).c_str(), (string("Layer-face " + de::toString(layerFaceNdx))).c_str(), referenceFrame, renderedFrame, threshold);
}